

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3VdbeClearObject(sqlite3 *db,Vdbe *p)

{
  SubProgram *pSVar1;
  SubProgram *pNext;
  SubProgram *pSub;
  Vdbe *p_local;
  sqlite3 *db_local;
  
  if (p->aColName != (Mem *)0x0) {
    releaseMemArray(p->aColName,(uint)p->nResColumn * 5);
    sqlite3DbFreeNN(db,p->aColName);
  }
  pNext = p->pProgram;
  while (pNext != (SubProgram *)0x0) {
    pSVar1 = pNext->pNext;
    vdbeFreeOpArray(db,pNext->aOp,pNext->nOp);
    sqlite3DbFree(db,pNext);
    pNext = pSVar1;
  }
  if (p->eVdbeState != '\0') {
    releaseMemArray(p->aVar,(int)p->nVar);
    if (p->pVList != (VList *)0x0) {
      sqlite3DbFreeNN(db,p->pVList);
    }
    if (p->pFree != (void *)0x0) {
      sqlite3DbFreeNN(db,p->pFree);
    }
  }
  vdbeFreeOpArray(db,p->aOp,p->nOp);
  sqlite3DbFree(db,p->zSql);
  return;
}

Assistant:

static void sqlite3VdbeClearObject(sqlite3 *db, Vdbe *p){
  SubProgram *pSub, *pNext;
  assert( p->db==0 || p->db==db );
  if( p->aColName ){
    releaseMemArray(p->aColName, p->nResColumn*COLNAME_N);
    sqlite3DbFreeNN(db, p->aColName);
  }
  for(pSub=p->pProgram; pSub; pSub=pNext){
    pNext = pSub->pNext;
    vdbeFreeOpArray(db, pSub->aOp, pSub->nOp);
    sqlite3DbFree(db, pSub);
  }
  if( p->eVdbeState!=VDBE_INIT_STATE ){
    releaseMemArray(p->aVar, p->nVar);
    if( p->pVList ) sqlite3DbFreeNN(db, p->pVList);
    if( p->pFree ) sqlite3DbFreeNN(db, p->pFree);
  }
  vdbeFreeOpArray(db, p->aOp, p->nOp);
  sqlite3DbFree(db, p->zSql);
#ifdef SQLITE_ENABLE_NORMALIZE
  sqlite3DbFree(db, p->zNormSql);
  {
    DblquoteStr *pThis, *pNext;
    for(pThis=p->pDblStr; pThis; pThis=pNext){
      pNext = pThis->pNextStr;
      sqlite3DbFree(db, pThis);
    }
  }
#endif
#ifdef SQLITE_ENABLE_STMT_SCANSTATUS
  {
    int i;
    for(i=0; i<p->nScan; i++){
      sqlite3DbFree(db, p->aScan[i].zName);
    }
    sqlite3DbFree(db, p->aScan);
  }
#endif
}